

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,_duckdb::interval_t,_duckdb::interval_t,_duckdb::LowerInclusiveBetweenOperator,_false,_false,_true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  interval_t upper;
  interval_t lower;
  interval_t input;
  bool bVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  int64_t *piVar5;
  idx_t *piVar6;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ulong in_R8;
  SelectionVector *in_R9;
  SelectionVector *in_stack_00000008;
  SelectionVector *in_stack_00000010;
  bool comparison_result;
  idx_t cidx;
  idx_t bidx;
  idx_t aidx;
  idx_t result_idx;
  idx_t i;
  idx_t false_count;
  idx_t true_count;
  uint7 in_stack_ffffffffffffff58;
  bool bVar7;
  idx_t in_stack_ffffffffffffff60;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff68;
  SelectionVector *in_stack_ffffffffffffff70;
  ulong uStack_48;
  long lStack_40;
  
  lStack_40 = 0;
  for (uStack_48 = 0; uStack_48 < in_R8; uStack_48 = uStack_48 + 1) {
    SelectionVector::get_index(in_RCX,uStack_48);
    iVar2 = SelectionVector::get_index(in_R9,uStack_48);
    iVar3 = SelectionVector::get_index(in_stack_00000008,uStack_48);
    iVar4 = SelectionVector::get_index(in_stack_00000010,uStack_48);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    bVar7 = false;
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      bVar7 = false;
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        bVar7 = false;
        if (bVar1) {
          piVar5 = (int64_t *)(in_RSI + iVar3 * 0x10);
          in_stack_ffffffffffffff70 = (SelectionVector *)*piVar5;
          piVar6 = (idx_t *)(in_RDX + iVar4 * 0x10);
          in_stack_ffffffffffffff60 = *piVar6;
          in_stack_ffffffffffffff68 = (TemplatedValidityMask<unsigned_long> *)piVar6[1];
          input.micros = *(int64_t *)(in_RDI + iVar2 * 0x10);
          input._0_8_ = piVar5[1];
          lower.micros = (int64_t)in_stack_ffffffffffffff70;
          lower._0_8_ = in_stack_ffffffffffffff68;
          upper.days._3_1_ = 0;
          upper._0_7_ = in_stack_ffffffffffffff58;
          upper.micros = in_stack_ffffffffffffff60;
          bVar7 = LowerInclusiveBetweenOperator::Operation<duckdb::interval_t>(input,lower,upper);
        }
      }
    }
    SelectionVector::set_index
              (in_stack_ffffffffffffff70,(idx_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60)
    ;
    lStack_40 = (ulong)((bVar7 ^ 0xffU) & 1) + lStack_40;
  }
  return in_R8 - lStack_40;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}